

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_range_iterator.cc
# Opt level: O0

void __thiscall s2shapeutil::RangeIterator::SeekTo(RangeIterator *this,RangeIterator *target)

{
  bool bVar1;
  S2CellId y;
  bool local_61;
  bool local_51;
  S2CellId local_48;
  S2CellId local_40;
  uint64 local_38;
  S2CellId local_30;
  S2CellId local_28;
  uint64 local_20;
  RangeIterator *local_18;
  RangeIterator *target_local;
  RangeIterator *this_local;
  
  local_18 = target;
  target_local = this;
  local_20 = (uint64)range_min(target);
  S2ShapeIndex::Iterator::Seek(&this->it_,(S2CellId)local_20);
  bVar1 = S2ShapeIndex::Iterator::done(&this->it_);
  local_51 = true;
  if (!bVar1) {
    local_30 = S2ShapeIndex::Iterator::id(&this->it_);
    local_28 = S2CellId::range_min(&local_30);
    local_38 = (uint64)range_max(local_18);
    local_51 = operator>(local_28,(S2CellId)local_38);
  }
  if (local_51 != false) {
    bVar1 = S2ShapeIndex::Iterator::Prev(&this->it_);
    local_61 = false;
    if (bVar1) {
      local_48 = S2ShapeIndex::Iterator::id(&this->it_);
      local_40 = S2CellId::range_max(&local_48);
      y = id(local_18);
      local_61 = ::operator<(local_40,y);
    }
    if (local_61 != false) {
      S2ShapeIndex::Iterator::Next(&this->it_);
    }
  }
  Refresh(this);
  return;
}

Assistant:

void RangeIterator::SeekTo(const RangeIterator& target) {
  it_.Seek(target.range_min());
  // If the current cell does not overlap "target", it is possible that the
  // previous cell is the one we are looking for.  This can only happen when
  // the previous cell contains "target" but has a smaller S2CellId.
  if (it_.done() || it_.id().range_min() > target.range_max()) {
    if (it_.Prev() && it_.id().range_max() < target.id()) it_.Next();
  }
  Refresh();
}